

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

void ktxHashList_ConstructCopy(ktxHashList *pHead,ktxHashList orig)

{
  ktxHashListEntry *entry;
  
  *pHead = (ktxHashList)0x0;
  if (orig != (ktxHashList)0x0) {
    do {
      ktxHashList_AddKVPair(pHead,orig->key,orig->valueLen,orig->value);
      orig = (ktxHashList)(orig->hh).next;
    } while (orig != (ktxHashList)0x0);
  }
  return;
}

Assistant:

void
ktxHashList_ConstructCopy(ktxHashList* pHead, ktxHashList orig)
{
    ktxHashListEntry* entry = orig;
    *pHead = NULL;
    for (; entry != NULL; entry = ktxHashList_Next(entry)) {
        (void)ktxHashList_AddKVPair(pHead,
                                    entry->key, entry->valueLen, entry->value);
    }
}